

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O0

bool tinyobj::exportFaceGroupToShape
               (shape_t *shape,
               map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *vertexCache,vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,
               vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
               *faceGroup,vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,
               int material_id,string *name,bool clearCache,uint flags,string *err)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *psVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  vertex_index *in_RCX;
  vector<float,_std::allocator<float>_> *in_RDX;
  string *in_RDI;
  value_type_conflict2 *in_R8;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  *in_R9;
  undefined8 extraout_XMM0_Qb;
  float3 fVar10;
  string *in_stack_00000018;
  byte in_stack_00000020;
  uint in_stack_00000028;
  string *in_stack_00000030;
  stringstream ss;
  float3 normal;
  float3 v13;
  float3 v12;
  float3 v3;
  float3 v2_1;
  float3 v1_1;
  size_t iIndices;
  size_t nIndexs;
  uint v;
  size_t k_1;
  uint v2;
  uint v1;
  uint v0;
  size_t k;
  size_t npolys;
  vertex_index i2;
  vertex_index i1;
  vertex_index i0;
  vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *face;
  size_t i;
  bool normals_calculation;
  bool triangulate;
  value_type_conflict2 *in_stack_fffffffffffffc58;
  value_type_conflict2 *pvVar11;
  const_reference in_stack_fffffffffffffc60;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *in_stack_fffffffffffffc68;
  ostream *in_stack_fffffffffffffc70;
  float3 *in_stack_fffffffffffffc78;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc80;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcc0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcc8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcd0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcd8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd00;
  vertex_index *in_stack_fffffffffffffd08;
  string local_2d8 [48];
  stringstream local_2a8 [16];
  ostream local_298 [376];
  undefined8 local_120;
  value_type local_118;
  undefined8 local_10c;
  value_type local_104;
  float3 local_100;
  float3 local_f4;
  anon_union_12_2_6556afac_for_float3_0 local_e8;
  anon_union_12_2_6556afac_for_float3_0 local_d8;
  anon_union_12_2_6556afac_for_float3_0 local_c8;
  ulong local_b8;
  size_type local_b0;
  undefined1 local_a5;
  uint local_a4;
  ulong local_a0;
  undefined1 local_95;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  vertex_index local_74;
  vertex_index local_68;
  undefined8 local_5c;
  int local_54;
  const_reference local_50;
  ulong local_48;
  byte local_3b;
  byte local_3a;
  byte local_39;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  *local_38;
  value_type_conflict2 *local_30;
  vertex_index *local_28;
  vector<float,_std::allocator<float>_> *local_20;
  string *local_10;
  bool local_1;
  
  local_39 = in_stack_00000020 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  bVar3 = std::
          vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ::empty((vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   *)in_stack_fffffffffffffc70);
  if (bVar3) {
    local_1 = false;
  }
  else {
    local_3a = (in_stack_00000028 & 1) == 1;
    local_3b = (in_stack_00000028 & 2) == 2;
    for (local_48 = 0; uVar2 = local_48,
        sVar4 = std::
                vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ::size(local_38), uVar2 < sVar4; local_48 = local_48 + 1) {
      local_50 = std::
                 vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                 ::operator[](local_38,local_48);
      pvVar5 = std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::
               operator[](local_50,0);
      local_5c._0_4_ = pvVar5->v_idx;
      local_5c._4_4_ = pvVar5->vt_idx;
      local_54 = pvVar5->vn_idx;
      vertex_index::vertex_index(&local_68,-1);
      pvVar5 = std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::
               operator[](local_50,1);
      local_74.v_idx = pvVar5->v_idx;
      local_74.vt_idx = pvVar5->vt_idx;
      local_74.vn_idx = pvVar5->vn_idx;
      local_80 = std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::size
                           (local_50);
      if ((local_3a & 1) == 0) {
        for (local_a0 = 0; pvVar11 = local_30, local_a0 < local_80; local_a0 = local_a0 + 1) {
          in_stack_fffffffffffffce8 = local_10 + 0x20;
          in_stack_fffffffffffffd00 = local_20;
          in_stack_fffffffffffffd08 = local_28;
          in_stack_fffffffffffffc60 =
               std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::
               operator[](local_50,local_a0);
          local_a4 = updateVertex((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                                   *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                  in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                  in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc70,(value_type_conflict1 *)in_stack_fffffffffffffc68);
          in_stack_fffffffffffffc58 = pvVar11;
        }
        local_a5 = (undefined1)local_80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                   (value_type_conflict4 *)in_stack_fffffffffffffc68);
      }
      else {
        for (local_88 = 2; local_88 < local_80; local_88 = local_88 + 1) {
          local_68.v_idx = local_74.v_idx;
          local_68.vt_idx = local_74.vt_idx;
          local_68.vn_idx = local_74.vn_idx;
          pvVar5 = std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::
                   operator[](local_50,local_88);
          local_74.v_idx = pvVar5->v_idx;
          local_74.vt_idx = pvVar5->vt_idx;
          local_74.vn_idx = pvVar5->vn_idx;
          local_8c = updateVertex((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                                   *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                  in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                  in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
          local_90 = updateVertex((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                                   *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                  in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                  in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
          in_stack_fffffffffffffc60 = &local_74;
          in_stack_fffffffffffffc58 = local_30;
          local_94 = updateVertex((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                                   *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                  in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                  in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc70,(value_type_conflict1 *)in_stack_fffffffffffffc68);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc70,(value_type_conflict1 *)in_stack_fffffffffffffc68);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc70,(value_type_conflict1 *)in_stack_fffffffffffffc68);
          local_95 = 3;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict4 *)in_stack_fffffffffffffc68);
        }
      }
    }
    if (((local_3b & 1) != 0) &&
       (bVar3 = std::vector<float,_std::allocator<float>_>::empty
                          ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc70),
       bVar3)) {
      local_b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_10 + 0x68)
                           );
      if (local_b0 % 3 == 0) {
        std::vector<float,_std::allocator<float>_>::size
                  ((vector<float,_std::allocator<float>_> *)(local_10 + 0x20));
        std::vector<float,_std::allocator<float>_>::resize
                  (in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        for (local_b8 = 0; local_b8 < local_b0; local_b8 = local_b8 + 3) {
          float3::float3((float3 *)&local_c8.field_1);
          float3::float3((float3 *)&local_d8.field_1);
          float3::float3((float3 *)&local_e8.field_1);
          psVar6 = local_10 + 0x20;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          local_c8.coord[2] = pvVar8[2];
          local_c8._0_8_ = *(undefined8 *)pvVar8;
          psVar6 = local_10 + 0x20;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8 + 1);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          local_d8.coord[2] = pvVar8[2];
          local_d8._0_8_ = *(undefined8 *)pvVar8;
          psVar6 = local_10 + 0x20;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8 + 2);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          local_e8.coord[2] = pvVar8[2];
          local_e8._0_8_ = *(undefined8 *)pvVar8;
          float3::float3(&local_f4,(float3 *)&local_c8.field_1,(float3 *)&local_d8.field_1);
          float3::float3(&local_100,(float3 *)&local_c8.field_1,(float3 *)&local_e8.field_1);
          fVar10 = float3::crossproduct
                             ((float3 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          local_118 = fVar10.field_0._8_4_;
          auVar1._8_8_ = extraout_XMM0_Qb;
          auVar1._0_8_ = fVar10.field_0._0_8_;
          local_120 = vmovlpd_avx(auVar1);
          local_10c = local_120;
          local_104 = local_118;
          float3::normalize((float3 *)in_stack_fffffffffffffc60);
          psVar6 = local_10 + 0x38;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          *(undefined8 *)pvVar8 = local_10c;
          pvVar8[2] = local_104;
          psVar6 = local_10 + 0x38;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8 + 1);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          *(undefined8 *)pvVar8 = local_10c;
          pvVar8[2] = local_104;
          psVar6 = local_10 + 0x38;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (local_10 + 0x68),local_b8 + 2);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)psVar6,(ulong)(*pvVar7 * 3));
          *(undefined8 *)pvVar8 = local_10c;
          pvVar8[2] = local_104;
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_2a8);
        poVar9 = std::operator<<(local_298,"WARN: The shape ");
        poVar9 = std::operator<<(poVar9,in_stack_00000018);
        in_stack_fffffffffffffc70 =
             std::operator<<(poVar9,
                             " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object."
                            );
        std::ostream::operator<<(in_stack_fffffffffffffc70,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(in_stack_00000030,local_2d8);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::stringstream::~stringstream(local_2a8);
      }
    }
    std::__cxx11::string::operator=(local_10,in_stack_00000018);
    std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::swap
              ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68);
    if ((local_39 & 1) != 0) {
      std::
      map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
      ::clear((map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
               *)0x12a8f8);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool exportFaceGroupToShape(
    shape_t &shape, std::map<vertex_index, unsigned int> vertexCache,
    const std::vector<float> &in_positions,
    const std::vector<float> &in_normals,
    const std::vector<float> &in_texcoords,
    const std::vector<std::vector<vertex_index> > &faceGroup,
    std::vector<tag_t> &tags, const int material_id, const std::string &name,
    bool clearCache, unsigned int flags, std::string& err ) {
  if (faceGroup.empty()) {
    return false;
  }

  bool triangulate( ( flags & triangulation ) == triangulation );
  bool normals_calculation( ( flags & calculate_normals ) == calculate_normals );

  // Flatten vertices and indices
  for (size_t i = 0; i < faceGroup.size(); i++) {
    const std::vector<vertex_index> &face = faceGroup[i];

    vertex_index i0 = face[0];
    vertex_index i1(-1);
    vertex_index i2 = face[1];

    size_t npolys = face.size();

    if (triangulate) {

      // Polygon -> triangle fan conversion
      for (size_t k = 2; k < npolys; k++) {
        i1 = i2;
        i2 = face[k];

        unsigned int v0 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i0);
        unsigned int v1 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i1);
        unsigned int v2 = updateVertex(
            vertexCache, shape.mesh.positions, shape.mesh.normals,
            shape.mesh.texcoords, in_positions, in_normals, in_texcoords, i2);

        shape.mesh.indices.push_back(v0);
        shape.mesh.indices.push_back(v1);
        shape.mesh.indices.push_back(v2);

        shape.mesh.num_vertices.push_back(3);
        shape.mesh.material_ids.push_back(material_id);
      }
    } else {

      for (size_t k = 0; k < npolys; k++) {
        unsigned int v =
            updateVertex(vertexCache, shape.mesh.positions, shape.mesh.normals,
                         shape.mesh.texcoords, in_positions, in_normals,
                         in_texcoords, face[k]);

        shape.mesh.indices.push_back(v);
      }

      shape.mesh.num_vertices.push_back(static_cast<unsigned char>(npolys));
      shape.mesh.material_ids.push_back(material_id); // per face
    }
  }

  if (normals_calculation && shape.mesh.normals.empty()) {
	  const size_t nIndexs = shape.mesh.indices.size();
	  if (nIndexs % 3 == 0) {
		  shape.mesh.normals.resize(shape.mesh.positions.size());
		  for (size_t iIndices = 0; iIndices < nIndexs; iIndices += 3) {
			  float3 v1, v2, v3;
			  memcpy(&v1, &shape.mesh.positions[shape.mesh.indices[iIndices] * 3], sizeof(float3));
			  memcpy(&v2, &shape.mesh.positions[shape.mesh.indices[iIndices + 1] * 3], sizeof(float3));
			  memcpy(&v3, &shape.mesh.positions[shape.mesh.indices[iIndices + 2] * 3], sizeof(float3));

			  float3 v12(v1, v2);
			  float3 v13(v1, v3);

			  float3 normal = v12.crossproduct(v13);
			  normal.normalize();

			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 1] * 3], &normal, sizeof(float3));
			  memcpy(&shape.mesh.normals[shape.mesh.indices[iIndices + 2] * 3], &normal, sizeof(float3));
		  }
	  } else {

		  std::stringstream ss;
		  ss << "WARN: The shape " << name << " does not have a topology of triangles, therfore the normals calculation could not be performed. Select the tinyobj::triangulation flag for this object." << std::endl;
		  err += ss.str();
	  }
  }

  shape.name = name;
  shape.mesh.tags.swap(tags);

  if (clearCache)
    vertexCache.clear();

  return true;
}